

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EndEmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo
                 )

{
  Scope *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Scope *pSVar5;
  Scope *scope;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeBlock *pnodeBlock_local;
  
  bVar3 = BlockHasOwnScope(pnodeBlock,byteCodeGenerator);
  if (bVar3) {
    pSVar1 = pnodeBlock->scope;
    if (pSVar1 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x372,"(scope)","scope");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pSVar5 = ByteCodeGenerator::GetCurrentScope(byteCodeGenerator);
    if (pSVar1 != pSVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x373,"(scope == byteCodeGenerator->GetCurrentScope())",
                         "scope == byteCodeGenerator->GetCurrentScope()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ByteCodeGenerator::PopScope(byteCodeGenerator);
  }
  ByteCodeGenerator::RecordEndScopeObject(byteCodeGenerator,(ParseNode *)pnodeBlock);
  return;
}

Assistant:

void EndEmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    if (BlockHasOwnScope(pnodeBlock, byteCodeGenerator))
    {
        Scope *scope = pnodeBlock->scope;
        Assert(scope);
        Assert(scope == byteCodeGenerator->GetCurrentScope());
        byteCodeGenerator->PopScope();
    }

    byteCodeGenerator->RecordEndScopeObject(pnodeBlock);
}